

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

string * __thiscall
ent::stringvalue::asstring_abi_cxx11_(string *__return_storage_ptr__,stringvalue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  stringvalue *local_18;
  stringvalue *this_local;
  
  local_18 = this;
  this_local = (stringvalue *)__return_storage_ptr__;
  cstrescape<std::__cxx11::string>(&local_58,&this->_value);
  std::operator+(&local_38,"\"",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string asstring()
    {
        return "\""+cstrescape(_value)+"\"";
    }